

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_benchmark.cpp
# Opt level: O3

void __thiscall tst_benchmark::valueFinally(tst_benchmark *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  QArrayData *pQVar3;
  PromiseData<Data> *this_00;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined **ppuVar6;
  bool bVar7;
  char cVar8;
  PromiseDataBase<void,_void_()> *pPVar9;
  PromiseDataBase<Data,_void_(const_Data_&)> *this_01;
  PromiseData<Data> *this_02;
  QSharedData *pQVar10;
  QPromiseReject<Data> *in_R8;
  char *reject;
  QByteArrayView QVar11;
  PromiseResolver<Data> resolver_3;
  PromiseResolver<void> resolver;
  int value_1;
  PromiseResolver<void> resolver_2;
  int value;
  QArrayData *local_1f8;
  QArrayData *pQStack_1f0;
  QPromise<Data> *local_1e8;
  PromiseData<Data> *local_1e0;
  PromiseData<Data> *local_1d8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data> local_1d0;
  function<void_()> local_1c8;
  QArrayData *local_1a8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data> local_1a0;
  _Any_data local_198;
  code *local_188;
  code *pcStack_180;
  QSharedData *local_178;
  int local_16c;
  _Any_data local_168;
  _Manager_type local_158;
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  QPromiseBase<Data> local_118;
  QPromise<Data> local_108;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<Data>::Data> local_f8;
  QArrayData *pQStack_f0;
  undefined **local_e8;
  _Any_data local_d8;
  code *local_c8;
  code *pcStack_c0;
  _Any_data local_b8;
  code *local_a8;
  code *pcStack_a0;
  _Any_data local_98;
  code *local_88;
  code *pcStack_80;
  _func_int **local_78;
  _func_int **local_70;
  undefined **local_68;
  undefined **local_60;
  _func_int **local_58;
  _Any_data local_50;
  code *local_40;
  
  local_108.super_QPromiseBase<Data>._vptr_QPromiseBase =
       (_func_int **)
       CONCAT44(local_108.super_QPromiseBase<Data>._vptr_QPromiseBase._4_4_,0xffffffff);
  DAT_00123240 = 0;
  DAT_00123244._0_4_ = 0;
  Logger::logs()::logs = 1;
  DAT_00123244._4_4_ = 1;
  local_118._vptr_QPromiseBase = (_func_int **)CONCAT44(local_118._vptr_QPromiseBase._4_4_,0x2a);
  QtPromise::QPromiseBase<Data>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:263:24),_0>
            ((QPromiseBase<Data> *)&local_168,(Data_conflict *)&local_118);
  uVar5 = local_168._8_8_;
  local_168._M_unused._M_object = &PTR__QPromiseBase_001229b8;
  if ((PromiseData<Data> *)local_168._8_8_ != (PromiseData<Data> *)0x0) {
    LOCK();
    (((QSharedData *)(local_168._8_8_ + 8))->ref).super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
         (((QSharedData *)(local_168._8_8_ + 8))->ref).super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pPVar9 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  pPVar9->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&pPVar9->super_QSharedData = 0;
  (pPVar9->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->m_catchers).d.size = 0;
  (pPVar9->m_handlers).d.size = 0;
  (pPVar9->m_catchers).d.d = (Data *)0x0;
  (pPVar9->m_handlers).d.d = (Data *)0x0;
  (pPVar9->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  *(undefined8 *)&pPVar9->m_lock = 0;
  *(undefined8 *)&pPVar9->m_settled = 0;
  (pPVar9->m_error).m_data._M_exception_object = (void *)0x0;
  local_178 = (QSharedData *)&PTR__PromiseDataBase_00122bb8;
  pPVar9->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00122bb8;
  QReadWriteLock::QReadWriteLock(&pPVar9->m_lock,0);
  pPVar9->m_settled = false;
  (pPVar9->m_handlers).d.d = (Data *)0x0;
  (pPVar9->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  (pPVar9->m_handlers).d.size = 0;
  (pPVar9->m_catchers).d.d = (Data *)0x0;
  (pPVar9->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->m_catchers).d.size = 0;
  (pPVar9->m_error).m_data._M_exception_object = (void *)0x0;
  local_58 = (_func_int **)&PTR__PromiseDataBase_00122b50;
  pPVar9->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00122b50;
  LOCK();
  (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_1d8 = (PromiseData<Data> *)&pPVar9->super_QSharedData;
  local_60 = &PTR__QPromiseBase_00122b18;
  local_1c8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00122b18;
  local_1c8.super__Function_base._M_functor._8_8_ = pPVar9;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&local_198,(QPromise<void> *)&local_1c8);
  local_1c8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00122958;
  if ((PromiseDataBase<void,_void_()> *)local_1c8.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_1c8.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_1c8.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (**(code **)(*(long *)local_1c8.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  uVar4 = local_198._M_unused._0_8_;
  local_68 = &PTR__QPromiseBase_00122958;
  if ((QArrayData *)local_198._M_unused._0_8_ == (QArrayData *)0x0) {
    local_1f8 = (QArrayData *)0x0;
LAB_001075ee:
    pQStack_1f0 = (QArrayData *)0x0;
    bVar7 = true;
  }
  else {
    LOCK();
    *(int *)local_198._M_unused._0_8_ = *local_198._M_unused._M_object + 1;
    UNLOCK();
    if ((QArrayData *)local_198._M_unused._0_8_ == (QArrayData *)0x0) {
      local_1f8 = (QArrayData *)local_198._M_unused._0_8_;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      goto LAB_001075ee;
    }
    LOCK();
    *(int *)local_198._M_unused._0_8_ = *local_198._M_unused._M_object + 1;
    UNLOCK();
    local_1f8 = (QArrayData *)local_198._M_unused._0_8_;
    LOCK();
    *(int *)local_198._M_unused._0_8_ = *local_198._M_unused._M_object + 1;
    UNLOCK();
    pQStack_1f0 = (QArrayData *)local_198._M_unused._0_8_;
    LOCK();
    *(int *)local_198._M_unused._0_8_ = *local_198._M_unused._M_object + 1;
    UNLOCK();
    bVar7 = false;
  }
  pQVar3 = pQStack_1f0;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a8 = (code *)0x0;
  pcStack_a0 = (code *)0x0;
  local_1e8 = &local_108;
  local_b8._M_unused._M_object = operator_new(0x18);
  *(QArrayData **)local_b8._M_unused._0_8_ = local_1f8;
  if (local_1f8 != (QArrayData *)0x0) {
    LOCK();
    (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(QArrayData **)((long)local_b8._M_unused._0_8_ + 8) = pQStack_1f0;
  if (pQStack_1f0 == (QArrayData *)0x0) {
    *(QPromise<Data> **)((long)local_b8._M_unused._0_8_ + 0x10) = local_1e8;
    pcStack_a0 = std::
                 _Function_handler<void_(const_Data_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<void_(const_Data_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(QPromise<Data> **)((long)local_b8._M_unused._0_8_ + 0x10) = local_1e8;
    pcStack_a0 = std::
                 _Function_handler<void_(const_Data_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_a8 = std::
               _Function_handler<void_(const_Data_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    if (pQStack_1f0 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pQStack_1f0,0x10);
      }
    }
  }
  if (local_1f8 != (QArrayData *)0x0) {
    LOCK();
    (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_1f8,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::addHandler
            ((PromiseDataBase<Data,_void_(const_Data_&)> *)uVar5,
             (function<void_(const_Data_&)> *)&local_b8);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  local_1f8 = (QArrayData *)uVar4;
  if ((QArrayData *)uVar4 != (QArrayData *)0x0) {
    LOCK();
    *(int *)uVar4 = *(int *)uVar4 + 1;
    UNLOCK();
  }
  if (!bVar7) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_d8._M_unused._M_object = (void *)0x0;
  local_d8._8_8_ = 0;
  local_c8 = (code *)0x0;
  pcStack_c0 = (code *)0x0;
  pQStack_1f0 = pQVar3;
  local_1e8 = &local_108;
  local_d8._M_unused._M_object = operator_new(0x18);
  *(QArrayData **)local_d8._M_unused._0_8_ = local_1f8;
  if (local_1f8 != (QArrayData *)0x0) {
    LOCK();
    (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(QArrayData **)((long)local_d8._M_unused._0_8_ + 8) = pQStack_1f0;
  if (pQStack_1f0 == (QArrayData *)0x0) {
    *(QPromise<Data> **)((long)local_d8._M_unused._0_8_ + 0x10) = local_1e8;
    pcStack_c0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(QPromise<Data> **)((long)local_d8._M_unused._0_8_ + 0x10) = local_1e8;
    pcStack_c0 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_c8 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
    if (pQStack_1f0 != (QArrayData *)0x0) {
      LOCK();
      (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(pQStack_1f0,0x10);
      }
    }
  }
  if (local_1f8 != (QArrayData *)0x0) {
    LOCK();
    (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_1f8,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::addCatcher
            ((PromiseDataBase<Data,_void_(const_Data_&)> *)uVar5,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_d8);
  if (local_c8 != (code *)0x0) {
    (*local_c8)(&local_d8,&local_d8,__destroy_functor);
  }
  if (!bVar7) {
    LOCK();
    (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pQVar3,0x10);
    }
  }
  if ((QArrayData *)uVar4 != (QArrayData *)0x0) {
    LOCK();
    *(int *)uVar4 = *(int *)uVar4 + -1;
    UNLOCK();
    if (*(int *)uVar4 == 0) {
      operator_delete((void *)uVar4,0x10);
    }
  }
  if ((QArrayData *)local_198._M_unused._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_198._M_unused._0_8_ = *local_198._M_unused._M_object + -1;
    UNLOCK();
    if (*local_198._M_unused._M_object == 0) {
      operator_delete(local_198._M_unused._M_object,0x10);
    }
  }
  bVar7 = QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::isPending
                    ((PromiseDataBase<Data,_void_(const_Data_&)> *)uVar5);
  if (!bVar7) {
    QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::dispatch
              ((PromiseDataBase<Data,_void_(const_Data_&)> *)uVar5);
  }
  pQVar1 = (QSharedData *)(uVar5 + 8);
  LOCK();
  (((QSharedData *)(uVar5 + 8))->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i =
       (((QSharedData *)(uVar5 + 8))->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  this_01 = (PromiseDataBase<Data,_void_(const_Data_&)> *)operator_new(0x68);
  this_01->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01->super_QSharedData = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  *(undefined8 *)&this_01->m_lock = 0;
  *(undefined8 *)&this_01->m_settled = 0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  local_70 = (_func_int **)&PTR__PromiseDataBase_00122a68;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseDataBase_00122a68;
  QReadWriteLock::QReadWriteLock(&this_01->m_lock,0);
  pQVar2 = &this_01->super_QSharedData;
  this_01->m_settled = false;
  (this_01->m_handlers).d.d = (Data *)0x0;
  (this_01->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  (this_01->m_handlers).d.size = 0;
  (this_01->m_catchers).d.d = (Data *)0x0;
  (this_01->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_01->m_catchers).d.size = 0;
  (this_01->m_error).m_data._M_exception_object = (void *)0x0;
  local_78 = (_func_int **)&PTR__PromiseData_001229f0;
  this_01->_vptr_PromiseDataBase = (_func_int **)&PTR__PromiseData_001229f0;
  this_01[1]._vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&this_01[1].super_QSharedData = 0;
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (this_01->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_1c8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_001229b8;
  local_1c8.super__Function_base._M_functor._8_8_ = this_01;
  QtPromisePrivate::PromiseResolver<Data>::PromiseResolver
            ((PromiseResolver<Data> *)&local_198,(QPromise<Data> *)&local_1c8);
  local_1c8.super__Function_base._M_functor._M_unused._M_object = &PTR__QPromiseBase_00122928;
  if ((PromiseDataBase<Data,_void_(const_Data_&)> *)local_1c8.super__Function_base._M_functor._8_8_
      != (PromiseDataBase<Data,_void_(const_Data_&)> *)0x0) {
    LOCK();
    pQVar10 = (QSharedData *)(local_1c8.super__Function_base._M_functor._8_8_ + 8);
    (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<Data,_void_(const_Data_&)> *)
        local_1c8.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<Data,_void_(const_Data_&)> *)0x0)) {
      (**(code **)(*(long *)local_1c8.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  if ((QArrayData *)local_198._M_unused._0_8_ == (QArrayData *)0x0) {
    local_148._M_unused._M_object = (QArrayData *)0x0;
    local_f8.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)local_198._M_unused._0_8_ = *local_198._M_unused._M_object + 1;
    UNLOCK();
    local_148._M_unused._M_object = local_198._M_unused._M_object;
    if ((QArrayData *)local_198._M_unused._0_8_ == (QArrayData *)0x0) {
      local_f8.d = (Data *)0x0;
LAB_001079f9:
      LOCK();
      *(int *)local_198._M_unused._0_8_ = *local_198._M_unused._M_object + 1;
      UNLOCK();
      if ((QArrayData *)local_f8.d == (QArrayData *)0x0) goto LAB_00107a11;
    }
    else {
      LOCK();
      *(int *)local_198._M_unused._0_8_ = *local_198._M_unused._M_object + 1;
      UNLOCK();
      local_f8.d = (Data *)local_198._M_unused._0_8_;
      if ((QArrayData *)local_198._M_unused._0_8_ != (QArrayData *)0x0) goto LAB_001079f9;
    }
    LOCK();
    (((QBasicAtomicInt *)&(local_f8.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_f8.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
LAB_00107a11:
  local_1e0 = (PromiseData<Data> *)uVar5;
  LOCK();
  (((QSharedData *)(uVar5 + 8))->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
  _q_value.super___atomic_base<int>._M_i =
       (((QSharedData *)(uVar5 + 8))->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
       _q_value.super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_1e8 = (QPromise<Data> *)&PTR__QPromiseBase_001229b8;
  local_98._M_unused._M_object = (void *)0x0;
  local_98._8_8_ = 0;
  local_88 = (code *)0x0;
  pcStack_80 = (code *)0x0;
  local_1f8 = (QArrayData *)local_148._M_unused._0_8_;
  pQStack_1f0 = (QArrayData *)local_f8.d;
  local_98._M_unused._M_object = operator_new(0x20);
  *(QArrayData **)local_98._M_unused._0_8_ = local_1f8;
  if (local_1f8 != (QArrayData *)0x0) {
    LOCK();
    (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(QArrayData **)((long)local_98._M_unused._0_8_ + 8) = pQStack_1f0;
  if (pQStack_1f0 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_98._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_00122928;
  *(PromiseData<Data> **)((long)local_98._M_unused._0_8_ + 0x18) = local_1e0;
  if (local_1e0 == (PromiseData<Data> *)0x0) {
    *(undefined ***)((long)local_98._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_001229b8;
    pcStack_80 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
    local_1e8 = (QPromise<Data> *)&PTR__QPromiseBase_00122928;
  }
  else {
    LOCK();
    pQVar10 = &(local_1e0->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
    pQVar10->ref = (QAtomicInt)((int)pQVar10->ref + 1);
    UNLOCK();
    *(undefined ***)((long)local_98._M_unused._0_8_ + 0x10) = &PTR__QPromiseBase_001229b8;
    pcStack_80 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
                 ::_M_invoke;
    local_88 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
               ::_M_manager;
    local_1e8 = (QPromise<Data> *)&PTR__QPromiseBase_00122928;
    if (local_1e0 != (PromiseData<Data> *)0x0) {
      LOCK();
      pQVar10 = &(local_1e0->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
      pQVar10->ref = (QAtomicInt)((int)pQVar10->ref + -1);
      UNLOCK();
      if ((((QAtomicInteger<int>)pQVar10->ref).super_QAtomicInteger<int> == (QAtomicInteger<int>)0x0
          ) && (local_1e0 != (PromiseData<Data> *)0x0)) {
        (*(local_1e0->super_PromiseDataBase<Data,_void_(const_Data_&)>)._vptr_PromiseDataBase[1])();
      }
    }
  }
  if (pQStack_1f0 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pQStack_1f0,0x10);
    }
  }
  if (local_1f8 != (QArrayData *)0x0) {
    LOCK();
    (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_1f8,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            (pPVar9,(function<void_()> *)&local_98);
  if (local_88 != (code *)0x0) {
    (*local_88)(&local_98,&local_98,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<Data>,QtPromise::QPromiseReject<Data>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_148,
             (QPromiseResolve<Data> *)&local_f8,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (pPVar9,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if ((QArrayData *)local_f8.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_f8.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_f8.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_f8.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i == 0) {
      operator_delete(local_f8.d,0x10);
    }
  }
  if ((QArrayData *)local_148._M_unused._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_148._M_unused._0_8_ = *local_148._M_unused._M_object + -1;
    UNLOCK();
    if (*local_148._M_unused._M_object == 0) {
      operator_delete(local_148._M_unused._M_object,0x10);
    }
  }
  if ((QArrayData *)local_198._M_unused._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_198._M_unused._0_8_ = *local_198._M_unused._M_object + -1;
    UNLOCK();
    if (*local_198._M_unused._M_object == 0) {
      operator_delete(local_198._M_unused._M_object,0x10);
    }
  }
  bVar7 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar9);
  if (!bVar7) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(pPVar9);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (**(code **)(*(long *)uVar5 + 8))(uVar5);
  }
  LOCK();
  (((QAtomicInt *)&local_1d8->super_PromiseDataBase<Data,_void_(const_Data_&)>)->
  super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i =
       (((QAtomicInt *)&local_1d8->super_PromiseDataBase<Data,_void_(const_Data_&)>)->
       super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
       _M_i + -1;
  UNLOCK();
  if ((((QAtomicInt *)&local_1d8->super_PromiseDataBase<Data,_void_(const_Data_&)>)->
      super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>.
      _M_i == 0) {
    (*pPVar9->_vptr_PromiseDataBase[1])(pPVar9);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (**(code **)(*(long *)uVar5 + 8))(uVar5);
  }
  bVar7 = QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::isPending(this_01);
  while (bVar7 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar7 = QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::isPending(this_01);
  }
  LOCK();
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + 1);
  UNLOCK();
  LOCK();
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int> == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  LOCK();
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
        super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int> == 0) {
    (*this_01->_vptr_PromiseDataBase[1])(this_01);
  }
  local_168._M_unused._M_object = &PTR__QPromiseBase_00122928;
  if ((PromiseData<Data> *)local_168._8_8_ != (PromiseData<Data> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_168._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<Data> *)local_168._8_8_ != (PromiseData<Data> *)0x0)) {
      (**(code **)(*(long *)local_168._8_8_ + 8))();
    }
  }
  DAT_00123244._4_4_ = DAT_00123244._4_4_ + -1;
  cVar8 = QTest::qCompare(Logger::logs()::logs,1,"Data::logs().ctor","1",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0xc9);
  if (cVar8 == '\0') {
    return;
  }
  cVar8 = QTest::qCompare(DAT_00123240,0,"Data::logs().copy","0",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0xca);
  if (cVar8 == '\0') {
    return;
  }
  cVar8 = QTest::qCompare((int)DAT_00123244,1,"Data::logs().move","1",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0xcb);
  if (cVar8 == '\0') {
    return;
  }
  cVar8 = QTest::qCompare(DAT_00123244._4_4_,0,"Data::logs().refs","0",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0xcc);
  if (cVar8 == '\0') {
    return;
  }
  reject = 
  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
  ;
  cVar8 = QTest::qCompare((int)local_108.super_QPromiseBase<Data>._vptr_QPromiseBase,0x2a,"value",
                          "42",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0xcd);
  if (cVar8 == '\0') {
    return;
  }
  local_16c = -1;
  Logger::logs()::logs = 0;
  DAT_00123240 = 0;
  DAT_00123244._0_4_ = 0;
  DAT_00123244._4_4_ = 0;
  QVar11.m_data = (storage_type *)((long)&iRam0000000000000000 + 3);
  QVar11.m_size = (qsizetype)&local_1f8;
  QString::fromUtf8(QVar11);
  local_f8.d = (Data *)local_1f8;
  pQStack_f0 = pQStack_1f0;
  local_e8 = (undefined **)local_1e8;
  QtPromise::QPromiseBase<Data>::
  QPromiseBase<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_simonbrunel[P]qtpromise_include____src_qtpromise_qpromise_inl:173:24),_0>
            (&local_118,(QString *)&local_f8);
  local_118._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001229b8;
  if (local_118.m_d.d != (PromiseData<Data> *)0x0) {
    LOCK();
    pQVar1 = &((local_118.m_d.d)->super_PromiseDataBase<Data,_void_(const_Data_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_1d8 = local_118.m_d.d;
  pPVar9 = (PromiseDataBase<void,_void_()> *)operator_new(0x58);
  pPVar9->_vptr_PromiseDataBase = (_func_int **)0x0;
  *(undefined8 *)&pPVar9->super_QSharedData = 0;
  (pPVar9->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->m_catchers).d.size = 0;
  (pPVar9->m_handlers).d.size = 0;
  (pPVar9->m_catchers).d.d = (Data *)0x0;
  (pPVar9->m_handlers).d.d = (Data *)0x0;
  (pPVar9->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  *(undefined8 *)&pPVar9->m_lock = 0;
  *(undefined8 *)&pPVar9->m_settled = 0;
  (pPVar9->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar9->_vptr_PromiseDataBase = (_func_int **)local_178;
  QReadWriteLock::QReadWriteLock(&pPVar9->m_lock,0);
  ppuVar6 = local_68;
  pPVar9->m_settled = false;
  (pPVar9->m_handlers).d.d = (Data *)0x0;
  (pPVar9->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  (pPVar9->m_handlers).d.size = 0;
  (pPVar9->m_catchers).d.d = (Data *)0x0;
  (pPVar9->m_catchers).d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar9->m_catchers).d.size = 0;
  (pPVar9->m_error).m_data._M_exception_object = (void *)0x0;
  pPVar9->_vptr_PromiseDataBase = local_58;
  LOCK();
  (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_178 = &pPVar9->super_QSharedData;
  LOCK();
  (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pPVar9->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  local_1c8.super__Function_base._M_functor._M_unused._M_object = local_60;
  local_1c8.super__Function_base._M_functor._8_8_ = pPVar9;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver
            ((PromiseResolver<void> *)&local_168,(QPromise<void> *)&local_1c8);
  local_1c8.super__Function_base._M_functor._M_unused._M_object = ppuVar6;
  if ((PromiseDataBase<void,_void_()> *)local_1c8.super__Function_base._M_functor._8_8_ !=
      (PromiseDataBase<void,_void_()> *)0x0) {
    LOCK();
    pQVar1 = (QSharedData *)(local_1c8.super__Function_base._M_functor._8_8_ + 8);
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseDataBase<void,_void_()> *)local_1c8.super__Function_base._M_functor._8_8_ !=
        (PromiseDataBase<void,_void_()> *)0x0)) {
      (**(code **)(*(long *)local_1c8.super__Function_base._M_functor._8_8_ + 8))();
    }
  }
  uVar5 = local_168._M_unused._0_8_;
  if ((QArrayData *)local_168._M_unused._0_8_ == (QArrayData *)0x0) {
    local_1f8 = (QArrayData *)0x0;
LAB_00107f78:
    pQStack_1f0 = (QArrayData *)0x0;
    bVar7 = true;
  }
  else {
    LOCK();
    *(int *)local_168._M_unused._0_8_ = *local_168._M_unused._M_object + 1;
    UNLOCK();
    if ((QArrayData *)local_168._M_unused._0_8_ == (QArrayData *)0x0) {
      local_1f8 = (QArrayData *)local_168._M_unused._0_8_;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      goto LAB_00107f78;
    }
    LOCK();
    *(int *)local_168._M_unused._0_8_ = *local_168._M_unused._M_object + 1;
    UNLOCK();
    local_1f8 = (QArrayData *)local_168._M_unused._0_8_;
    LOCK();
    *(int *)local_168._M_unused._0_8_ = *local_168._M_unused._M_object + 1;
    UNLOCK();
    pQStack_1f0 = (QArrayData *)local_168._M_unused._0_8_;
    LOCK();
    *(int *)local_168._M_unused._0_8_ = *local_168._M_unused._M_object + 1;
    UNLOCK();
    bVar7 = false;
  }
  pQVar3 = pQStack_1f0;
  local_198._M_unused._M_object = (void *)0x0;
  local_198._8_8_ = 0;
  local_188 = (code *)0x0;
  pcStack_180 = (code *)0x0;
  local_1e8 = (QPromise<Data> *)&local_16c;
  local_198._M_unused._M_object = operator_new(0x18);
  *(QArrayData **)local_198._M_unused._0_8_ = local_1f8;
  if (local_1f8 != (QArrayData *)0x0) {
    LOCK();
    (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(QArrayData **)((long)local_198._M_unused._0_8_ + 8) = pQStack_1f0;
  if (pQStack_1f0 == (QArrayData *)0x0) {
    *(QPromise<Data> **)((long)local_198._M_unused._0_8_ + 0x10) = local_1e8;
    pcStack_180 = std::
                  _Function_handler<void_(const_Data_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                  ::_M_invoke;
    local_188 = std::
                _Function_handler<void_(const_Data_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                ::_M_manager;
  }
  else {
    LOCK();
    pQStack_1f0->ref_ = (QBasicAtomicInt)(*(int *)&pQStack_1f0->ref_ + 1);
    UNLOCK();
    *(QPromise<Data> **)((long)local_198._M_unused._0_8_ + 0x10) = local_1e8;
    pcStack_180 = std::
                  _Function_handler<void_(const_Data_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                  ::_M_invoke;
    local_188 = std::
                _Function_handler<void_(const_Data_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                ::_M_manager;
    if (pQStack_1f0 != (QArrayData *)0x0) {
      LOCK();
      pQStack_1f0->ref_ = (QBasicAtomicInt)(*(int *)&pQStack_1f0->ref_ + -1);
      UNLOCK();
      if (*(int *)&pQStack_1f0->ref_ == 0) {
        operator_delete(pQStack_1f0,0x10);
      }
    }
  }
  if (local_1f8 != (QArrayData *)0x0) {
    LOCK();
    (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_1f8,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::addHandler
            (&local_1d8->super_PromiseDataBase<Data,_void_(const_Data_&)>,
             (function<void_(const_Data_&)> *)&local_198);
  if (local_188 != (code *)0x0) {
    (*local_188)(&local_198,&local_198,__destroy_functor);
  }
  local_1f8 = (QArrayData *)uVar5;
  if ((QArrayData *)uVar5 != (QArrayData *)0x0) {
    LOCK();
    *(int *)uVar5 = *(int *)uVar5 + 1;
    UNLOCK();
  }
  if (!bVar7) {
    LOCK();
    pQVar3->ref_ = (QBasicAtomicInt)(*(int *)&pQVar3->ref_ + 1);
    UNLOCK();
  }
  local_148._M_unused._M_object = (void *)0x0;
  local_148._8_8_ = 0;
  local_138 = (code *)0x0;
  pcStack_130 = (code *)0x0;
  pQStack_1f0 = pQVar3;
  local_1e8 = (QPromise<Data> *)&local_16c;
  local_148._M_unused._M_object = operator_new(0x18);
  this_00 = local_1d8;
  *(QArrayData **)local_148._M_unused._0_8_ = local_1f8;
  if (local_1f8 != (QArrayData *)0x0) {
    LOCK();
    (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(QArrayData **)((long)local_148._M_unused._0_8_ + 8) = pQStack_1f0;
  if (pQStack_1f0 == (QArrayData *)0x0) {
    *(QPromise<Data> **)((long)local_148._M_unused._0_8_ + 0x10) = local_1e8;
    pcStack_130 = std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                  ::_M_invoke;
    local_138 = std::
                _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                ::_M_manager;
  }
  else {
    LOCK();
    pQStack_1f0->ref_ = (QBasicAtomicInt)(*(int *)&pQStack_1f0->ref_ + 1);
    UNLOCK();
    *(QPromise<Data> **)((long)local_148._M_unused._0_8_ + 0x10) = local_1e8;
    pcStack_130 = std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                  ::_M_invoke;
    local_138 = std::
                _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                ::_M_manager;
    if (pQStack_1f0 != (QArrayData *)0x0) {
      LOCK();
      pQStack_1f0->ref_ = (QBasicAtomicInt)(*(int *)&pQStack_1f0->ref_ + -1);
      UNLOCK();
      if (*(int *)&pQStack_1f0->ref_ == 0) {
        operator_delete(pQStack_1f0,0x10);
      }
    }
  }
  if (local_1f8 != (QArrayData *)0x0) {
    LOCK();
    (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_1f8,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::addCatcher
            (&this_00->super_PromiseDataBase<Data,_void_(const_Data_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_148);
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,__destroy_functor);
  }
  if (!bVar7) {
    LOCK();
    pQVar3->ref_ = (QBasicAtomicInt)(*(int *)&pQVar3->ref_ + -1);
    UNLOCK();
    if (*(int *)&pQVar3->ref_ == 0) {
      operator_delete(pQVar3,0x10);
    }
  }
  if ((QArrayData *)uVar5 != (QArrayData *)0x0) {
    LOCK();
    *(int *)uVar5 = *(int *)uVar5 + -1;
    UNLOCK();
    if (*(int *)uVar5 == 0) {
      operator_delete((void *)uVar5,0x10);
    }
  }
  if ((QArrayData *)local_168._M_unused._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_168._M_unused._0_8_ = *local_168._M_unused._M_object + -1;
    UNLOCK();
    if (*local_168._M_unused._M_object == 0) {
      operator_delete(local_168._M_unused._M_object,0x10);
    }
  }
  bVar7 = QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::isPending
                    (&this_00->super_PromiseDataBase<Data,_void_(const_Data_&)>);
  if (!bVar7) {
    QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::dispatch
              (&this_00->super_PromiseDataBase<Data,_void_(const_Data_&)>);
  }
  pQVar1 = &(this_00->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
  LOCK();
  pQVar2 = &(this_00->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  this_02 = (PromiseData<Data> *)operator_new(0x68);
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData = 0;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_02->m_value).m_data.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_catchers.d.size = 0;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_handlers.d.size = 0;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_catchers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_handlers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_lock = 0;
  *(undefined8 *)&(this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_settled = 0;
  (this_02->m_value).m_data.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>)._vptr_PromiseDataBase = local_70;
  QReadWriteLock::QReadWriteLock
            (&(this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_lock,0);
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_settled = false;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_handlers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_Data_&)>_> *)0x0;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_handlers.d.size = 0;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_catchers.d.d = (Data *)0x0;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_catchers.d.size = 0;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>)._vptr_PromiseDataBase = local_78;
  (this_02->m_value).m_data.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this_02->m_value).m_data.super___shared_ptr<Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar2 = &(this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar10 = &(this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
  LOCK();
  pQVar2 = &(this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_108.super_QPromiseBase<Data>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001229b8;
  local_108.super_QPromiseBase<Data>.m_d.d = this_02;
  QtPromisePrivate::PromiseResolver<Data>::PromiseResolver
            ((PromiseResolver<Data> *)&local_1a0,&local_108);
  local_108.super_QPromiseBase<Data>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00122928;
  if (local_108.super_QPromiseBase<Data>.m_d.d != (PromiseData<Data> *)0x0) {
    LOCK();
    pQVar2 = &((local_108.super_QPromiseBase<Data>.m_d.d)->
              super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_108.super_QPromiseBase<Data>.m_d.d != (PromiseData<Data> *)0x0)) {
      (*((local_108.super_QPromiseBase<Data>.m_d.d)->
        super_PromiseDataBase<Data,_void_(const_Data_&)>)._vptr_PromiseDataBase[1])();
    }
  }
  if ((QArrayData *)local_1a0.d == (QArrayData *)0x0) {
    local_1a8 = (QArrayData *)0x0;
    local_1d0.d = (Data *)0x0;
    goto LAB_0010836c;
  }
  LOCK();
  (((QBasicAtomicInt *)&(local_1a0.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i =
       (((QBasicAtomicInt *)&(local_1a0.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
       _M_i + 1;
  UNLOCK();
  local_1a8 = (QArrayData *)local_1a0.d;
  if ((QArrayData *)local_1a0.d == (QArrayData *)0x0) {
    local_1d0.d = (Data *)0x0;
LAB_00108357:
    LOCK();
    (((QBasicAtomicInt *)&(local_1a0.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_1a0.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
    if ((QArrayData *)local_1d0.d == (QArrayData *)0x0) goto LAB_0010836c;
  }
  else {
    LOCK();
    (((QBasicAtomicInt *)&(local_1a0.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_1a0.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
    local_1d0.d = local_1a0.d;
    if ((QArrayData *)local_1a0.d != (QArrayData *)0x0) goto LAB_00108357;
  }
  LOCK();
  (((QBasicAtomicInt *)&(local_1d0.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i =
       (((QBasicAtomicInt *)&(local_1d0.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
       _M_i + 1;
  UNLOCK();
LAB_0010836c:
  local_1e0 = this_00;
  LOCK();
  pQVar2 = &(this_00->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_1e8 = (QPromise<Data> *)&PTR__QPromiseBase_001229b8;
  local_1c8.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_1c8.super__Function_base._M_functor._8_8_ = 0;
  local_1c8.super__Function_base._M_manager = (_Manager_type)0x0;
  local_1c8._M_invoker = (_Invoker_type)0x0;
  local_1f8 = local_1a8;
  pQStack_1f0 = (QArrayData *)local_1d0.d;
  local_1c8.super__Function_base._M_functor._M_unused._M_object = operator_new(0x20);
  *(QArrayData **)local_1c8.super__Function_base._M_functor._M_unused._0_8_ = local_1f8;
  if (local_1f8 != (QArrayData *)0x0) {
    LOCK();
    (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(QArrayData **)((long)local_1c8.super__Function_base._M_functor._M_unused._0_8_ + 8) =
       pQStack_1f0;
  if (pQStack_1f0 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  *(undefined ***)((long)local_1c8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
       &PTR__QPromiseBase_00122928;
  *(PromiseData<Data> **)((long)local_1c8.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
       local_1e0;
  if (local_1e0 == (PromiseData<Data> *)0x0) {
    *(undefined ***)((long)local_1c8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         &PTR__QPromiseBase_001229b8;
    local_1c8._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_invoke;
    local_1c8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_manager;
    local_1e8 = (QPromise<Data> *)&PTR__QPromiseBase_00122928;
  }
  else {
    LOCK();
    pQVar2 = &(local_1e0->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
    (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
    *(undefined ***)((long)local_1c8.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         &PTR__QPromiseBase_001229b8;
    local_1c8._M_invoker =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_invoke;
    local_1c8.super__Function_base._M_manager =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
         ::_M_manager;
    local_1e8 = (QPromise<Data> *)&PTR__QPromiseBase_00122928;
    if (local_1e0 != (PromiseData<Data> *)0x0) {
      LOCK();
      pQVar2 = &(local_1e0->super_PromiseDataBase<Data,_void_(const_Data_&)>).super_QSharedData;
      (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && (local_1e0 != (PromiseData<Data> *)0x0)) {
        (*(local_1e0->super_PromiseDataBase<Data,_void_(const_Data_&)>)._vptr_PromiseDataBase[1])();
      }
    }
  }
  if (pQStack_1f0 != (QArrayData *)0x0) {
    LOCK();
    (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i =
         (pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pQStack_1f0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(pQStack_1f0,0x10);
    }
  }
  if (local_1f8 != (QArrayData *)0x0) {
    LOCK();
    (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1f8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1f8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_1f8,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler(pPVar9,&local_1c8);
  if (local_1c8.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_1c8.super__Function_base._M_manager)
              ((_Any_data *)&local_1c8,(_Any_data *)&local_1c8,__destroy_functor);
  }
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<Data>,QtPromise::QPromiseReject<Data>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_168,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&local_1a8,
             (QPromiseResolve<Data> *)&local_1d0,(QPromiseReject<Data> *)reject);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            (pPVar9,(function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_168);
  if (local_158 != (_Manager_type)0x0) {
    (*local_158)(&local_168,&local_168,__destroy_functor);
  }
  if ((QArrayData *)local_1d0.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_1d0.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_1d0.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_1d0.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i == 0) {
      operator_delete(local_1d0.d,0x10);
    }
  }
  if (local_1a8 != (QArrayData *)0x0) {
    LOCK();
    (local_1a8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_1a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_1a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_1a8,0x10);
    }
  }
  if ((QArrayData *)local_1a0.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_1a0.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_1a0.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_1a0.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i == 0) {
      operator_delete(local_1a0.d,0x10);
    }
  }
  bVar7 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending(pPVar9);
  if (!bVar7) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch(pPVar9);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_00->super_PromiseDataBase<Data,_void_(const_Data_&)>)._vptr_PromiseDataBase[1])(this_00)
    ;
  }
  LOCK();
  (local_178->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (local_178->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((local_178->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*pPVar9->_vptr_PromiseDataBase[1])(pPVar9);
  }
  LOCK();
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_00->super_PromiseDataBase<Data,_void_(const_Data_&)>)._vptr_PromiseDataBase[1])(this_00)
    ;
  }
  bVar7 = QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::isPending
                    ((PromiseDataBase<Data,_void_(const_Data_&)> *)this_02);
  while (bVar7 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar7 = QtPromisePrivate::PromiseDataBase<Data,_void_(const_Data_&)>::isPending
                      ((PromiseDataBase<Data,_void_(const_Data_&)> *)this_02);
  }
  LOCK();
  (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>)._vptr_PromiseDataBase[1])(this_02)
    ;
  }
  LOCK();
  (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar10->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(this_02->super_PromiseDataBase<Data,_void_(const_Data_&)>)._vptr_PromiseDataBase[1])(this_02)
    ;
  }
  local_118._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00122928;
  if (local_118.m_d.d != (PromiseData<Data> *)0x0) {
    LOCK();
    pQVar1 = &((local_118.m_d.d)->super_PromiseDataBase<Data,_void_(const_Data_&)>).
              super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) && (local_118.m_d.d != (PromiseData<Data> *)0x0)) {
      (*((local_118.m_d.d)->super_PromiseDataBase<Data,_void_(const_Data_&)>)._vptr_PromiseDataBase
        [1])();
    }
  }
  if ((QArrayData *)local_f8.d != (QArrayData *)0x0) {
    LOCK();
    (((QBasicAtomicInt *)&(local_f8.d)->super_QSharedData)->_q_value).super___atomic_base<int>._M_i
         = (((QBasicAtomicInt *)&(local_f8.d)->super_QSharedData)->_q_value).
           super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)&(local_f8.d)->super_QSharedData)->_q_value).super___atomic_base<int>.
        _M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8.d,2,8);
    }
  }
  cVar8 = QTest::qCompare(Logger::logs()::logs,0,"Data::logs().ctor","0",
                          "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                          ,0xd8);
  if ((((cVar8 != '\0') &&
       (cVar8 = QTest::qCompare(DAT_00123240,0,"Data::logs().copy","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                                ,0xd9), cVar8 != '\0')) &&
      (cVar8 = QTest::qCompare((int)DAT_00123244,0,"Data::logs().move","0",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                               ,0xda), cVar8 != '\0')) &&
     (cVar8 = QTest::qCompare(DAT_00123244._4_4_,0,"Data::logs().refs","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                              ,0xdb), cVar8 != '\0')) {
    QTest::qCompare(local_16c,0x2a,"value","42",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/benchmark/tst_benchmark.cpp"
                    ,0xdc);
  }
  return;
}

Assistant:

void tst_benchmark::valueFinally()
{
    { // should not copy the value on continuation if fulfilled
        int value = -1;
        Data::logs().reset();
        QtPromise::QPromise<Data>::resolve(Data{42})
            .finally([&]() {
                value = 42;
            })
            .wait();

        QCOMPARE(Data::logs().ctor, 1);
        QCOMPARE(Data::logs().copy, 0);
        QCOMPARE(Data::logs().move, 1); // move value to the input and output promise data
        QCOMPARE(Data::logs().refs, 0);
        QCOMPARE(value, 42);
    }
    { // should not create value on continuation if rejected
        int value = -1;
        Data::logs().reset();
        QtPromise::QPromise<Data>::reject(QString{"foo"})
            .finally([&]() {
                value = 42;
            })
            .wait();

        QCOMPARE(Data::logs().ctor, 0);
        QCOMPARE(Data::logs().copy, 0);
        QCOMPARE(Data::logs().move, 0);
        QCOMPARE(Data::logs().refs, 0);
        QCOMPARE(value, 42);
    }
}